

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall gimage::ImageIO::load(ImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  bool bVar1;
  uint uVar2;
  reference ppBVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  const_iterator it;
  vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_> *in_stack_ffffffffffffff78
  ;
  __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
  *in_stack_ffffffffffffff80;
  allocator *paVar5;
  allocator local_59;
  string local_58 [16];
  string *in_stack_ffffffffffffffb8;
  IOException *in_stack_ffffffffffffffc0;
  __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
  local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::begin
            (in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<gimage::BasicImageIO*const*,std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>>
  ::__normal_iterator<gimage::BasicImageIO**>
            (in_stack_ffffffffffffff80,
             (__normal_iterator<gimage::BasicImageIO_**,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::end
              (in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator<
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<gimage::BasicImageIO_**,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      uVar4 = __cxa_allocate_exception(0x28);
      paVar5 = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Loading images from memory is not implemented",paVar5);
      gutil::IOException::IOException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
              ::operator*(&local_28);
    uVar2 = (*(*ppBVar3)->_vptr_BasicImageIO[0xd])(*ppBVar3,local_18,local_20);
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
    ::operator++(&local_28);
  }
  ppBVar3 = __gnu_cxx::
            __normal_iterator<gimage::BasicImageIO_*const_*,_std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>_>
            ::operator*(&local_28);
  (*(*ppBVar3)->_vptr_BasicImageIO[0xe])(*ppBVar3,local_10,local_18,local_20);
  return;
}

Assistant:

void ImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length)
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handles(data, length))
    {
      (*it)->load(image, data, length);
      return;
    }
  }

  throw gutil::IOException("Loading images from memory is not implemented");
}